

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint in_EDX;
  ImRect *in_RSI;
  ImGuiID in_R8D;
  ImGuiID in_R9D;
  float fVar3;
  undefined8 in_XMM0_Qa;
  ImVec2 IVar4;
  ImVec2 align;
  ImVec2 *unaff_retaddr;
  byte in_stack_00000008;
  undefined7 in_stack_00000009;
  char *in_stack_00000010;
  float in_stack_00000018;
  float in_stack_0000001c;
  ImGuiID in_stack_00000020;
  undefined4 in_stack_00000024;
  ImVec2 *in_stack_00000028;
  ImDrawList *in_stack_00000030;
  float ellipsis_max_x;
  float close_button_sz;
  ImGuiItemHoveredDataBackup last_item_backup;
  bool close_button_visible;
  bool close_button_pressed;
  ImRect text_ellipsis_clip_bb;
  ImVec2 unsaved_marker_pos;
  ImRect text_pixel_clip_bb;
  char *TAB_UNSAVED_MARKER;
  ImVec2 label_size;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffef8;
  ImGuiItemHoveredDataBackup *in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  undefined1 repeat;
  ImGuiMouseButton in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  float in_stack_ffffffffffffff34;
  ImVec2 *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  byte bVar5;
  undefined1 in_stack_ffffffffffffff67;
  byte bVar6;
  char *in_stack_ffffffffffffff68;
  ImVec2 *in_stack_ffffffffffffff70;
  ImVec2 in_stack_ffffffffffffff78;
  ImVec2 local_78;
  ImRect *in_stack_ffffffffffffff98;
  float local_60;
  float local_50;
  float local_c;
  float fStack_8;
  bool local_1;
  
  pIVar1 = GImGui;
  IVar4 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       in_stack_ffffffffffffff20,SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
                       (float)in_stack_ffffffffffffff18);
  fVar3 = ImRect::GetWidth(in_RSI);
  if (fVar3 <= 1.0) {
    local_1 = false;
  }
  else {
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,
                   (float)((ulong)in_stack_ffffffffffffff00 >> 0x20),
                   SUB84(in_stack_ffffffffffffff00,0));
    repeat = (undefined1)((uint)in_stack_ffffffffffffff0c >> 0x18);
    local_c = (float)in_XMM0_Qa;
    if ((in_EDX & 1) != 0) {
      align = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           in_stack_ffffffffffffff20,
                           SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
                           (float)in_stack_ffffffffffffff18);
      local_50 = IVar4.x;
      fVar3 = ImMin<float>((in_RSI->Min).x + local_c + local_50 + 2.0,local_60 - align.x);
      fStack_8 = (float)((ulong)in_XMM0_Qa >> 0x20);
      ImVec2::ImVec2(&local_78,fVar3,
                     (in_RSI->Min).y + fStack_8 + (float)(int)(pIVar1->FontSize * -0.25));
      IVar4 = ::operator-(in_stack_fffffffffffffef8,(ImVec2 *)0x251e44);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff78,0.0,0.0);
      in_stack_ffffffffffffff00 = (ImGuiItemHoveredDataBackup *)0x0;
      RenderTextClippedEx((ImDrawList *)IVar4,(ImVec2 *)in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          (char *)CONCAT17(in_stack_ffffffffffffff67,
                                           CONCAT16(in_stack_ffffffffffffff66,
                                                    in_stack_ffffffffffffff60)),
                          in_stack_ffffffffffffff58,(ImVec2 *)align,in_stack_ffffffffffffff98);
    }
    bVar6 = 0;
    bVar5 = 0;
    if (((in_R9D != 0) &&
        (((in_stack_00000008 & 1) != 0 ||
         (fVar3 = ImRect::GetWidth(in_RSI),
         (pIVar1->Style).TabMinWidthForUnselectedCloseButton <= fVar3)))) &&
       ((pIVar1->HoveredId == in_R8D ||
        ((pIVar1->HoveredId == in_R9D || (pIVar1->ActiveId == in_R9D)))))) {
      bVar5 = 1;
    }
    if ((bVar5 & 1) != 0) {
      ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup(in_stack_ffffffffffffff00);
      fVar3 = pIVar1->FontSize;
      PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffff34,
                   (ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff30,
                     (-local_c + -local_c + (in_RSI->Max).x) - fVar3,(in_RSI->Min).y);
      bVar2 = CloseButton(in_stack_00000020,(ImVec2 *)CONCAT44(in_stack_0000001c,in_stack_00000018))
      ;
      if (bVar2) {
        bVar6 = 1;
      }
      PopStyleVar(in_R9D);
      ImGuiItemHoveredDataBackup::Restore((ImGuiItemHoveredDataBackup *)&stack0xffffffffffffff3c);
      if (((in_EDX & 4) == 0) &&
         (bVar2 = IsMouseClicked(in_stack_ffffffffffffff10,(bool)repeat), bVar2)) {
        bVar6 = 1;
      }
    }
    RenderTextEllipsis(in_stack_00000030,in_stack_00000028,
                       (ImVec2 *)CONCAT44(in_stack_00000024,in_stack_00000020),in_stack_0000001c,
                       in_stack_00000018,in_stack_00000010,
                       (char *)CONCAT71(in_stack_00000009,in_stack_00000008),unaff_retaddr);
    local_1 = (bool)(bVar6 & 1);
  }
  return local_1;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForUnselectedCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    return close_button_pressed;
}